

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
::
insert<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                 table,size_t pos,uint *params)

{
  uint uVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  ArrayDisposer *pAVar4;
  uint uVar5;
  Entry *this_00;
  HashBucket *pHVar6;
  uint uVar7;
  ArrayDisposer *pAVar8;
  uint *in_R9;
  HashBucket *pHVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = table.ptr;
  if ((ulong)((long)(this_00->value).paramExports.disposer * 2) <
      ((long)(this_00->value).paramExports.ptr + pos) * 3 + 3) {
    HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
    ::rehash((HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
              *)this_00,pos * 3 + 3);
  }
  uVar1 = *in_R9;
  uVar5 = uVar1 * 0x8000 + ~uVar1;
  uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x809;
  uVar5 = uVar5 >> 0x10 ^ uVar5;
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((Array<kj::_::HashBucket> *)&(this_00->value).paramExports.size_)->ptr;
  pAVar4 = (this_00->value).paramExports.disposer;
  uVar7 = (int)pAVar4 - 1U & uVar5;
  pHVar6 = (HashBucket *)0x0;
  do {
    pHVar9 = (HashBucket *)(aVar3.value + (ulong)uVar7 * 8);
    uVar2 = pHVar9->value;
    if (uVar2 == 1) {
      if (pHVar6 == (HashBucket *)0x0) {
        pHVar6 = pHVar9;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar6 != (HashBucket *)0x0) {
          (this_00->value).paramExports.ptr = (uint *)((long)(this_00->value).paramExports.ptr - 1);
          pHVar9 = pHVar6;
        }
        *pHVar9 = (HashBucket)(((ulong)uVar5 | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                 )0x0;
        goto LAB_0033c917;
      }
      if ((pHVar9->hash == uVar5) && (*(uint *)(table.size_ + (ulong)(uVar2 - 2) * 0x30) == uVar1))
      {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_0033c917:
        MVar10.ptr.field_1.value = aVar3.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
    }
    pAVar8 = (ArrayDisposer *)((ulong)uVar7 + 1);
    uVar7 = (uint)pAVar8;
    if (pAVar8 == pAVar4) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }